

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O2

RGBA deqp::gles31::Functional::FboTestUtil::getFormatThreshold(TextureFormat *format)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  IVec4 bits;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  tcu::getTextureFormatBitDepth((tcu *)&local_30,format);
  uVar1 = calculateU8ConversionError(local_30);
  iVar2 = calculateU8ConversionError(local_2c);
  iVar3 = calculateU8ConversionError(local_28);
  iVar4 = calculateU8ConversionError(local_24);
  return (RGBA)(iVar4 << 0x18 | iVar3 << 0x10 | iVar2 << 8 | uVar1);
}

Assistant:

tcu::RGBA getFormatThreshold (const tcu::TextureFormat& format)
{
	const tcu::IVec4 bits = tcu::getTextureFormatBitDepth(format);

	return tcu::RGBA(calculateU8ConversionError(bits.x()),
					 calculateU8ConversionError(bits.y()),
					 calculateU8ConversionError(bits.z()),
					 calculateU8ConversionError(bits.w()));
}